

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void compile_control_verb_backtrackingpath(compiler_common *common,backtrack_common *current)

{
  PCRE2_UCHAR16 PVar1;
  sljit_compiler *compiler_00;
  then_trap_backtrack *ptVar2;
  sljit_jump *psVar3;
  sljit_label *label;
  sljit_label *label_00;
  sljit_jump *jump;
  sljit_label *loop;
  PCRE2_UCHAR16 opcode;
  sljit_compiler *compiler;
  backtrack_common *current_local;
  compiler_common *common_local;
  
  compiler_00 = common->compiler;
  PVar1 = *current->cc;
  if ((PVar1 == 0x9b) || (PVar1 == 0x9c)) {
    if (common->then_trap != (then_trap_backtrack *)0x0) {
      sljit_emit_op1(compiler_00,0x20,0xc,0,0x8e,(long)common->control_head_ptr);
      sljit_emit_op1(compiler_00,0x20,1,0,0x40,1);
      sljit_emit_op1(compiler_00,0x20,4,0,0x40,common->then_trap->start);
      psVar3 = sljit_emit_jump(compiler_00,0x18);
      label = sljit_emit_label(compiler_00);
      sljit_emit_op1(compiler_00,0x20,0xc,0,0x8c,0);
      label_00 = sljit_emit_label(compiler_00);
      sljit_set_label(psVar3,label_00);
      psVar3 = sljit_emit_cmp(compiler_00,1,0x8c,8,1,0);
      sljit_set_label(psVar3,label);
      psVar3 = sljit_emit_cmp(compiler_00,1,0x8c,0x10,4,0);
      sljit_set_label(psVar3,label);
      ptVar2 = common->then_trap;
      psVar3 = sljit_emit_jump(compiler_00,0x18);
      add_jump(compiler_00,&ptVar2->quit,psVar3);
      return;
    }
    if ((common->local_quit_available == 0) && (common->in_positive_assertion != 0)) {
      psVar3 = sljit_emit_jump(compiler_00,0x18);
      add_jump(compiler_00,&common->positive_assertion_quit,psVar3);
      return;
    }
  }
  if (common->local_quit_available == 0) {
    if (PVar1 == 0x9a) {
      sljit_emit_op1(compiler_00,0x20,1,0,0x8e,(long)common->control_head_ptr);
      sljit_emit_op1(compiler_00,0x20,2,0,0x40,(sljit_sw)(current->cc + 2));
      sljit_emit_icall(compiler_00,0x1a,0x111,0x40,0x181e30);
      sljit_emit_op1(compiler_00,0x20,2,0,1,0);
      psVar3 = sljit_emit_cmp(compiler_00,1,1,0,0x40,0);
      add_jump(compiler_00,&common->reset_match,psVar3);
    }
    else {
      if (PVar1 == 0x99) {
        sljit_emit_op1(compiler_00,0x20,2,0,0x8c,0);
      }
      else {
        sljit_emit_op1(compiler_00,0x20,2,0,0x40,0);
      }
      psVar3 = sljit_emit_jump(compiler_00,0x18);
      add_jump(compiler_00,&common->reset_match,psVar3);
    }
  }
  else if (common->quit_label == (sljit_label *)0x0) {
    psVar3 = sljit_emit_jump(compiler_00,0x18);
    add_jump(compiler_00,&common->quit,psVar3);
  }
  else {
    psVar3 = sljit_emit_jump(compiler_00,0x18);
    sljit_set_label(psVar3,common->quit_label);
  }
  return;
}

Assistant:

static SLJIT_INLINE void compile_control_verb_backtrackingpath(compiler_common *common, struct backtrack_common *current)
{
DEFINE_COMPILER;
PCRE2_UCHAR opcode = *current->cc;
struct sljit_label *loop;
struct sljit_jump *jump;

if (opcode == OP_THEN || opcode == OP_THEN_ARG)
  {
  if (common->then_trap != NULL)
    {
    SLJIT_ASSERT(common->control_head_ptr != 0);

    OP1(SLJIT_MOV, STACK_TOP, 0, SLJIT_MEM1(SLJIT_SP), common->control_head_ptr);
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_IMM, type_then_trap);
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_IMM, common->then_trap->start);
    jump = JUMP(SLJIT_JUMP);

    loop = LABEL();
    OP1(SLJIT_MOV, STACK_TOP, 0, SLJIT_MEM1(STACK_TOP), STACK(0));
    JUMPHERE(jump);
    CMPTO(SLJIT_NOT_EQUAL, SLJIT_MEM1(STACK_TOP), STACK(1), TMP1, 0, loop);
    CMPTO(SLJIT_NOT_EQUAL, SLJIT_MEM1(STACK_TOP), STACK(2), TMP2, 0, loop);
    add_jump(compiler, &common->then_trap->quit, JUMP(SLJIT_JUMP));
    return;
    }
  else if (!common->local_quit_available && common->in_positive_assertion)
    {
    add_jump(compiler, &common->positive_assertion_quit, JUMP(SLJIT_JUMP));
    return;
    }
  }

if (common->local_quit_available)
  {
  /* Abort match with a fail. */
  if (common->quit_label == NULL)
    add_jump(compiler, &common->quit, JUMP(SLJIT_JUMP));
  else
    JUMPTO(SLJIT_JUMP, common->quit_label);
  return;
  }

if (opcode == OP_SKIP_ARG)
  {
  SLJIT_ASSERT(common->control_head_ptr != 0 && TMP1 == SLJIT_R0 && STR_PTR == SLJIT_R1);
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->control_head_ptr);
  OP1(SLJIT_MOV, SLJIT_R1, 0, SLJIT_IMM, (sljit_sw)(current->cc + 2));
  sljit_emit_icall(compiler, SLJIT_CALL, SLJIT_RET(SW) | SLJIT_ARG1(SW) | SLJIT_ARG2(SW), SLJIT_IMM, SLJIT_FUNC_OFFSET(do_search_mark));

  OP1(SLJIT_MOV, STR_PTR, 0, SLJIT_R0, 0);
  add_jump(compiler, &common->reset_match, CMP(SLJIT_NOT_EQUAL, SLJIT_R0, 0, SLJIT_IMM, 0));
  return;
  }

if (opcode == OP_SKIP)
  OP1(SLJIT_MOV, STR_PTR, 0, SLJIT_MEM1(STACK_TOP), STACK(0));
else
  OP1(SLJIT_MOV, STR_PTR, 0, SLJIT_IMM, 0);
add_jump(compiler, &common->reset_match, JUMP(SLJIT_JUMP));
}